

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O2

_Bool previous_mode_performed_poorly
                (PREDICTION_MODE mode,MV_REFERENCE_FRAME ref_frame,uint (*vars) [8],
                int64_t (*uv_dist) [8])

{
  uint uVar1;
  long lVar2;
  byte bVar3;
  long lVar4;
  undefined7 in_register_00000031;
  long lVar5;
  long lVar6;
  uint uVar7;
  
  lVar6 = (long)(int)CONCAT71(in_register_00000031,ref_frame);
  uVar7 = 0xffffffff;
  lVar5 = 0x7fffffffffffffff;
  for (lVar4 = 0; lVar4 != 0x80; lVar4 = lVar4 + 0x20) {
    uVar1 = *(uint *)((long)*vars + lVar4 + lVar6 * 4);
    if (uVar1 <= uVar7) {
      uVar7 = uVar1;
    }
    lVar2 = *(long *)((long)*uv_dist + lVar4 * 2 + lVar6 * 8);
    if (lVar2 <= lVar5) {
      lVar5 = lVar2;
    }
  }
  bVar3 = (float)uVar7 * 1.125 < (float)vars[(ulong)mode - 0xd][lVar6];
  lVar4 = uv_dist[(ulong)mode - 0xd][lVar6];
  if ((lVar4 != 0x7fffffffffffffff) && (lVar5 != lVar4)) {
    bVar3 = -((float)uVar7 * 1.125 < (float)vars[(ulong)mode - 0xd][lVar6]) &
            -((float)lVar5 * 1.125 < (float)lVar4);
  }
  return (_Bool)(bVar3 & 1);
}

Assistant:

static inline bool previous_mode_performed_poorly(
    PREDICTION_MODE mode, MV_REFERENCE_FRAME ref_frame,
    const unsigned int (*vars)[REF_FRAMES],
    const int64_t (*uv_dist)[REF_FRAMES]) {
  unsigned int best_var = UINT_MAX;
  int64_t best_uv_dist = INT64_MAX;
  for (int midx = 0; midx < RTC_INTER_MODES; midx++) {
    best_var = AOMMIN(best_var, vars[midx][ref_frame]);
    best_uv_dist = AOMMIN(best_uv_dist, uv_dist[midx][ref_frame]);
  }
  assert(best_var != UINT_MAX && "Invalid variance data.");
  const float mult = 1.125f;
  bool var_bad = mult * best_var < vars[INTER_OFFSET(mode)][ref_frame];
  if (uv_dist[INTER_OFFSET(mode)][ref_frame] < INT64_MAX &&
      best_uv_dist != uv_dist[INTER_OFFSET(mode)][ref_frame]) {
    // If we have chroma info, then take it into account
    var_bad &= mult * best_uv_dist < uv_dist[INTER_OFFSET(mode)][ref_frame];
  }
  return var_bad;
}